

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O3

dictionary * iniparser_load(char *ininame)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  dictionary *d;
  char *pcVar5;
  size_t sVar6;
  ushort **ppuVar7;
  char *s;
  long lVar8;
  long lVar9;
  uint uVar10;
  char *__s;
  ulong uVar11;
  ulong uVar12;
  char line [1025];
  char val [1025];
  char section [1025];
  char key [1025];
  char tmp [2049];
  int local_188c;
  undefined8 local_1880;
  char local_1878 [1040];
  char local_1468;
  char local_1467;
  char local_1466;
  char local_1058 [1040];
  char local_c48 [1040];
  char local_838 [2056];
  
  __stream = fopen(ininame,"r");
  if (__stream == (FILE *)0x0) {
    d = (dictionary *)0x0;
    fprintf(_stderr,"iniparser: cannot open %s\n",ininame);
  }
  else {
    d = dictionary_new(0);
    if (d == (dictionary *)0x0) {
LAB_0010d6c5:
      fclose(__stream);
      d = (dictionary *)0x0;
    }
    else {
      local_1880 = ininame;
      memset(local_1878,0,0x400);
      memset(local_1058,0,0x400);
      memset(local_c48,0,0x400);
      memset(&local_1468,0,0x400);
      uVar10 = 0;
      local_188c = 0;
      do {
        uVar12 = 0;
        do {
          do {
            pcVar5 = fgets(local_1878 + uVar12,0x400 - (int)uVar12,__stream);
            if (pcVar5 == (char *)0x0) {
              if (local_188c == 0) goto LAB_0010d673;
              goto LAB_0010d660;
            }
            uVar10 = uVar10 + 1;
            sVar6 = strlen(local_1878);
            uVar4 = (uint)sVar6;
            uVar11 = (long)(int)uVar4 - 1;
          } while ((int)uVar11 == 0);
          if ((local_1878[(long)(int)uVar4 + -1] != '\n') && (iVar3 = feof(__stream), iVar3 == 0)) {
            fprintf(_stderr,"iniparser: input line too long in %s (%d)\n",local_1880,(ulong)uVar10);
            dictionary_del(d);
            goto LAB_0010d6c5;
          }
          if (0 < (int)uVar4) {
            lVar8 = (uVar11 & 0xffffffff) + 1;
            do {
              uVar4 = uVar4 - 1;
              uVar11 = (ulong)uVar4;
              cVar1 = local_1878[lVar8 + -1];
              if (((long)cVar1 != 10) &&
                 (ppuVar7 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar7 + (long)cVar1 * 2 + 1) & 0x20) == 0)) goto LAB_0010d3ed;
              local_1878[lVar8 + -1] = '\0';
              lVar9 = lVar8 + -1;
              bVar2 = 0 < lVar8;
              lVar8 = lVar9;
            } while (lVar9 != 0 && bVar2);
            uVar11 = 0xffffffff;
          }
LAB_0010d3ed:
          uVar12 = uVar11 & 0xffffffff;
          if ((int)uVar11 < 1) {
            uVar12 = 0;
          }
        } while (local_1878[uVar12] == '\\');
        sVar6 = strlen(local_1878);
        pcVar5 = (char *)malloc(sVar6);
        strcpy(pcVar5,local_1878);
        uVar4 = strstrip(pcVar5);
        if (((uVar4 == 0) || (cVar1 = *pcVar5, cVar1 == '#')) || (cVar1 == ';')) {
          free(pcVar5);
        }
        else {
          s = &local_1468;
          if ((cVar1 == '[') && (pcVar5[(ulong)uVar4 - 1] == ']')) {
            __s = local_1058;
            __isoc99_sscanf(pcVar5,"[%[^]]",__s);
            strstrip(__s);
            strlwc(__s,__s,uVar4);
            free(pcVar5);
            s = (char *)0x0;
          }
          else {
            iVar3 = __isoc99_sscanf(pcVar5,"%[^=] = \"%[^\"]\"",local_c48,s);
            if ((iVar3 == 2) ||
               ((iVar3 = __isoc99_sscanf(pcVar5,"%[^=] = \'%[^\']\'",local_c48,s), iVar3 == 2 ||
                (iVar3 = __isoc99_sscanf(pcVar5,"%[^=] = %[^;#]",local_c48,s), iVar3 == 2)))) {
              strstrip(local_c48);
              strlwc(local_c48,local_c48,uVar4);
              strstrip(s);
              if (local_1468 == '\'') {
                if (local_1467 == '\'') goto LAB_0010d553;
              }
              else if ((local_1468 == '\"') && (local_1467 == '\"')) {
LAB_0010d553:
                if (local_1466 == '\0') goto LAB_0010d5ad;
              }
            }
            else {
              iVar3 = __isoc99_sscanf(pcVar5,"%[^=] = %[;#]",local_c48,s);
              if ((iVar3 != 2) &&
                 (iVar3 = __isoc99_sscanf(pcVar5,"%[^=] %[=]",local_c48,s), iVar3 != 2)) {
                free(pcVar5);
                fprintf(_stderr,"iniparser: syntax error in %s (%d):\n",local_1880,(ulong)uVar10);
                fprintf(_stderr,"-> %s\n",local_1878);
                local_188c = local_188c + 1;
                goto LAB_0010d5f5;
              }
              strstrip(local_c48);
              strlwc(local_c48,local_c48,uVar4);
LAB_0010d5ad:
              local_1468 = '\0';
            }
            free(pcVar5);
            __s = local_838;
            sprintf(__s,"%s:%s",local_1058,local_c48);
          }
          local_188c = dictionary_set(d,__s,s);
        }
LAB_0010d5f5:
        memset(local_1878,0,0x400);
      } while (-1 < local_188c);
      iniparser_load_cold_1();
LAB_0010d660:
      dictionary_del(d);
      d = (dictionary *)0x0;
LAB_0010d673:
      fclose(__stream);
    }
  }
  return d;
}

Assistant:

dictionary * iniparser_load(const char * ininame)
{
    FILE * in ;

    char line    [ASCIILINESZ+1] ;
    char section [ASCIILINESZ+1] ;
    char key     [ASCIILINESZ+1] ;
    char tmp     [(ASCIILINESZ * 2) + 1] ;
    char val     [ASCIILINESZ+1] ;

    int  last=0 ;
    int  len ;
    int  lineno=0 ;
    int  errs=0;

    dictionary * dict ;

    if ((in=fopen(ininame, "r"))==NULL) {
        fprintf(stderr, "iniparser: cannot open %s\n", ininame);
        return NULL ;
    }

    dict = dictionary_new(0) ;
    if (!dict) {
        fclose(in);
        return NULL ;
    }

    memset(line,    0, ASCIILINESZ);
    memset(section, 0, ASCIILINESZ);
    memset(key,     0, ASCIILINESZ);
    memset(val,     0, ASCIILINESZ);
    last=0 ;

    while (fgets(line+last, ASCIILINESZ-last, in)!=NULL) {
        lineno++ ;
        len = (int)strlen(line)-1;
        if (len==0)
            continue;
        /* Safety check against buffer overflows */
        if (line[len]!='\n' && !feof(in)) {
            fprintf(stderr,
                    "iniparser: input line too long in %s (%d)\n",
                    ininame,
                    lineno);
            dictionary_del(dict);
            fclose(in);
            return NULL ;
        }
        /* Get rid of \n and spaces at end of line */
        while ((len>=0) &&
                ((line[len]=='\n') || (isspace(line[len])))) {
            line[len]=0 ;
            len-- ;
        }
        if (len < 0) { /* Line was entirely \n and/or spaces */
            len = 0;
        }
        /* Detect multi-line */
        if (line[len]=='\\') {
            /* Multi-line value */
            last=len ;
            continue ;
        } else {
            last=0 ;
        }
        switch (iniparser_line(line, section, key, val)) {
            case LINE_EMPTY:
            case LINE_COMMENT:
            break ;

            case LINE_SECTION:
            errs = dictionary_set(dict, section, NULL);
            break ;

            case LINE_VALUE:
            sprintf(tmp, "%s:%s", section, key);
            errs = dictionary_set(dict, tmp, val) ;
            break ;

            case LINE_ERROR:
            fprintf(stderr, "iniparser: syntax error in %s (%d):\n",
                    ininame,
                    lineno);
            fprintf(stderr, "-> %s\n", line);
            errs++ ;
            break;

            default:
            break ;
        }
        memset(line, 0, ASCIILINESZ);
        last=0;
        if (errs<0) {
            fprintf(stderr, "iniparser: memory allocation failure\n");
            break ;
        }
    }
    if (errs) {
        dictionary_del(dict);
        dict = NULL ;
    }
    fclose(in);
    return dict ;
}